

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O0

void __thiscall
kratos::InterfaceDefinition::InterfaceDefinition(InterfaceDefinition *this,string *name)

{
  string *name_local;
  InterfaceDefinition *this_local;
  
  IDefinition::IDefinition(&this->super_IDefinition);
  std::enable_shared_from_this<kratos::InterfaceDefinition>::enable_shared_from_this
            (&this->super_enable_shared_from_this<kratos::InterfaceDefinition>);
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_00d96430;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>_>_>_>
  ::map(&this->ports_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::map(&this->vars_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  ::map(&this->mod_ports_);
  return;
}

Assistant:

explicit InterfaceDefinition(std::string name) : name_(std::move(name)) {}